

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,string *linkLibraries,string *frameworkPath,
          string *linkPath)

{
  cmMakefile *pcVar1;
  string *psVar2;
  string local_1e8 [32];
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [8];
  string fwSearchFlag;
  undefined1 local_160 [8];
  string fwSearchFlagVar;
  char *stdLibs;
  string stdLibString;
  allocator<char> local_f1;
  undefined1 local_f0 [8];
  string standardLibsVar;
  string local_c8;
  string *local_a8;
  string *libPathTerminator;
  allocator<char> local_89;
  string local_88;
  string *local_68;
  string *libPathFlag;
  string linkLanguage;
  cmComputeLinkInformation *cli;
  string *linkPath_local;
  string *frameworkPath_local;
  string *linkLibraries_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmComputeLinkInformation *pcli_local;
  cmLocalGenerator *this_local;
  
  linkLanguage.field_2._8_8_ = pcli;
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_((string *)&libPathFlag,pcli);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"CMAKE_LIBRARY_PATH_FLAG",&local_89);
  psVar2 = cmMakefile::GetRequiredDefinition(pcVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pcVar1 = this->Makefile;
  local_68 = psVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_LIBRARY_PATH_TERMINATOR",
             (allocator<char> *)(standardLibsVar.field_2._M_local_buf + 0xf));
  psVar2 = cmMakefile::GetSafeDefinition(pcVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(standardLibsVar.field_2._M_local_buf + 0xf));
  local_a8 = psVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,"CMAKE_",&local_f1);
  std::allocator<char>::~allocator(&local_f1);
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_
            ((string *)((long)&stdLibString.field_2 + 8),
             (cmComputeLinkInformation *)linkLanguage.field_2._8_8_);
  std::__cxx11::string::operator+=
            ((string *)local_f0,(string *)(stdLibString.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(stdLibString.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_f0,"_STANDARD_LIBRARIES");
  std::__cxx11::string::string((string *)&stdLibs);
  fwSearchFlagVar.field_2._8_8_ = cmMakefile::GetDefinition(this->Makefile,(string *)local_f0);
  if ((char *)fwSearchFlagVar.field_2._8_8_ != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&stdLibs,(char *)fwSearchFlagVar.field_2._8_8_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_160,"CMAKE_",
             (allocator<char> *)(fwSearchFlag.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fwSearchFlag.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=((string *)local_160,(string *)&libPathFlag);
  std::__cxx11::string::operator+=((string *)local_160,"_FRAMEWORK_SEARCH_FLAG");
  psVar2 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_160);
  std::__cxx11::string::string((string *)local_188,(string *)psVar2);
  cmLinkLineComputer::ComputeFrameworkPath
            (&local_1a8,linkLineComputer,(cmComputeLinkInformation *)linkLanguage.field_2._8_8_,
             (string *)local_188);
  std::__cxx11::string::operator=((string *)frameworkPath,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  cmLinkLineComputer::ComputeLinkPath
            (&local_1c8,linkLineComputer,(cmComputeLinkInformation *)linkLanguage.field_2._8_8_,
             local_68,local_a8);
  std::__cxx11::string::operator=((string *)linkPath,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])
            (local_1e8,linkLineComputer,linkLanguage.field_2._8_8_,&stdLibs);
  std::__cxx11::string::operator=((string *)linkLibraries,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)&stdLibs);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)&libPathFlag);
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::string& linkLibraries, std::string& frameworkPath,
  std::string& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  const std::string& libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  const std::string& libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  std::string stdLibString;
  if (const char* stdLibs = this->Makefile->GetDefinition(standardLibsVar)) {
    stdLibString = stdLibs;
  }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  std::string fwSearchFlag =
    this->Makefile->GetSafeDefinition(fwSearchFlagVar);

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkPath =
    linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator);

  linkLibraries = linkLineComputer->ComputeLinkLibraries(cli, stdLibString);
}